

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::onMouseDrag(Sandbox *this,float _x,float _y,int _button)

{
  int iVar1;
  _func_int **pp_Var2;
  vec<2,_float,_(glm::qualifier)0> *in_RCX;
  Camera *pCVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar4;
  float fVar5;
  float fVar6;
  mat<3,_3,_float,_(glm::qualifier)0> local_50;
  ulong local_28;
  
  if ((this->uniforms).super_Scene.activeCamera == (Camera *)0x0) {
    return;
  }
  if (this->quilt_resolution < 0) {
    vera::getPixelDensity(false);
    iVar1 = vera::getWindowWidth();
    if (_x <= 0.0) {
      fVar4 = (float)(iVar1 + -2);
    }
    else {
      fVar4 = _x;
      if ((float)iVar1 <= _x) {
        fVar4 = 2.0;
      }
    }
    iVar1 = vera::getWindowHeight();
    if (_y <= 0.0) {
      fVar5 = (float)(iVar1 + -2);
    }
    else {
      fVar5 = _y;
      if ((float)iVar1 <= _y) {
        fVar5 = 2.0;
      }
    }
    if ((fVar4 == _x) && (!NAN(fVar4) && !NAN(_x))) {
      if ((fVar5 == _y) && (!NAN(fVar5) && !NAN(_y))) goto LAB_001e3329;
    }
    vera::setMousePosition(fVar4,fVar5);
  }
LAB_001e3329:
  if (_button == 1) {
    fVar4 = vera::getMouseVelX();
    fVar5 = vera::getMouseVelY();
    local_28 = CONCAT44(fVar5,fVar4) ^ 0x8000000080000000;
    glm::translate<float,(glm::qualifier)0>
              (&local_50,(glm *)&this->m_view2d,(mat<3,_3,_float,_(glm::qualifier)0> *)&local_28,
               in_RCX);
    (this->m_view2d).value[2].field_2 = local_50.value[2].field_2;
    (this->m_view2d).value[1].field_1 = local_50.value[1].field_1;
    (this->m_view2d).value[1].field_2 = local_50.value[1].field_2;
    (this->m_view2d).value[2].field_0 = local_50.value[2].field_0;
    (this->m_view2d).value[2].field_1 = local_50.value[2].field_1;
    (this->m_view2d).value[0].field_0 = local_50.value[0].field_0;
    (this->m_view2d).value[0].field_1 = local_50.value[0].field_1;
    (this->m_view2d).value[0].field_2 = local_50.value[0].field_2;
    (this->m_view2d).value[1].field_0 = local_50.value[1].field_0;
    (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
    fVar5 = vera::getMouseVelX();
    fVar4 = vera::getMouseVelY();
    if (50.0 <= ABS(fVar5)) {
      return;
    }
    if (50.0 <= ABS(fVar4)) {
      return;
    }
    fVar5 = this->m_camera_azimuth - fVar5;
    this->m_camera_azimuth = fVar5;
    fVar6 = fVar4 * -0.5 + this->m_camera_elevation;
    this->m_camera_elevation = fVar6;
    pCVar3 = (this->uniforms).super_Scene.activeCamera;
    pp_Var2 = (pCVar3->super_Node)._vptr_Node;
    fVar4 = extraout_XMM0_Da;
  }
  else {
    (*(((this->uniforms).super_Scene.activeCamera)->super_Node)._vptr_Node[0x4f])();
    fVar4 = vera::getMouseVelY();
    fVar4 = fVar4 * -0.008 + extraout_XMM0_Da_00;
    if (fVar4 <= 0.0) {
      return;
    }
    pCVar3 = (this->uniforms).super_Scene.activeCamera;
    fVar5 = this->m_camera_azimuth;
    fVar6 = this->m_camera_elevation;
    pp_Var2 = (pCVar3->super_Node)._vptr_Node;
  }
  local_50.value[0].field_2.z = 0.0;
  local_50.value[0].field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_50.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  (*pp_Var2[0x29])(fVar5,fVar6,fVar4,pCVar3,&local_50);
  pCVar3 = (this->uniforms).super_Scene.activeCamera;
  local_50.value[0].field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_50.value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_50.value[0].field_2.z = 0.0;
  (*(pCVar3->super_Node)._vptr_Node[0x30])(0,0,pCVar3,&local_50);
  return;
}

Assistant:

void Sandbox::onMouseDrag(float _x, float _y, int _button) {
    if (uniforms.activeCamera == nullptr)
        return;

    if (quilt_resolution < 0) {
        // If it's not playing on the HOLOPLAY
        // produce continue draging like blender
        //
        float x = _x;
        float y = _y;
        float pd = vera::getPixelDensity();

        if (x <= 0) x = vera::getWindowWidth() - 2;
        else if (x >= vera::getWindowWidth()) x = 2; 

        if (y <= 0) y = vera::getWindowHeight() - 2;
        else if (y >= vera::getWindowHeight()) y = 2;

        if (x != _x || y != _y) vera::setMousePosition(x, y);
    }

    if (_button == 1) {
        // Left-button drag is used to pan u_view2d.
        m_view2d = glm::translate(m_view2d, glm::vec2(-vera::getMouseVelX(),-vera::getMouseVelY()) );

        // Left-button drag is used to rotate geometry.
        float dist = uniforms.activeCamera->getDistance();

        float vel_x = vera::getMouseVelX();
        float vel_y = vera::getMouseVelY();

        if (fabs(vel_x) < 50.0 && fabs(vel_y) < 50.0) {
            m_camera_azimuth -= vel_x;
            m_camera_elevation -= vel_y * 0.5;
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    } 
    else {
        // Right-button drag is used to zoom geometry.
        float dist = uniforms.activeCamera->getDistance();
        dist += (-.008f * vera::getMouseVelY());
        if (dist > 0.0f) {
            uniforms.activeCamera->orbit(m_camera_azimuth, m_camera_elevation, dist);
            uniforms.activeCamera->lookAt(glm::vec3(0.0));
        }
    }
}